

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_analysis.cpp
# Opt level: O1

SERecurrentNode * __thiscall
spvtools::opt::ScalarEvolutionAnalysis::GetRecurrentTerm
          (ScalarEvolutionAnalysis *this,SENode *node,Loop *loop)

{
  bool bVar1;
  NodePtr pSVar2;
  NodePtr pSVar3;
  int iVar4;
  undefined4 extraout_var;
  dag_iterator itr;
  SERecurrentNode *local_e8;
  dag_iterator local_e0;
  dag_iterator local_88;
  SERecurrentNode *pSVar5;
  
  SENode::graph_begin(&local_e0,node);
  SENode::graph_end(&local_88,node);
  pSVar3 = local_88.current_;
  pSVar2 = local_e0.current_;
  std::
  _Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                  *)&local_88.parent_iterators_);
  if (pSVar2 != pSVar3) {
    do {
      iVar4 = (*(local_e0.current_)->_vptr_SENode[6])();
      pSVar5 = (SERecurrentNode *)CONCAT44(extraout_var,iVar4);
      if ((pSVar5 == (SERecurrentNode *)0x0) || (pSVar5->loop_ != loop)) {
        bVar1 = true;
      }
      else {
        bVar1 = false;
        local_e8 = pSVar5;
      }
      if (!bVar1) goto LAB_0060da3e;
      TreeDFIterator<spvtools::opt::SENode>::operator++(&local_e0);
      SENode::graph_end(&local_88,node);
      pSVar3 = local_88.current_;
      pSVar2 = local_e0.current_;
      std::
      _Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
      ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                      *)&local_88.parent_iterators_);
    } while (pSVar2 != pSVar3);
  }
  local_e8 = (SERecurrentNode *)0x0;
LAB_0060da3e:
  std::
  _Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
  ::~_Deque_base((_Deque_base<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>,_std::allocator<std::pair<spvtools::opt::SENode_*,___gnu_cxx::__normal_iterator<spvtools::opt::SENode_**,_std::vector<spvtools::opt::SENode_*,_std::allocator<spvtools::opt::SENode_*>_>_>_>_>_>
                  *)&local_e0.parent_iterators_);
  return local_e8;
}

Assistant:

SERecurrentNode* ScalarEvolutionAnalysis::GetRecurrentTerm(SENode* node,
                                                           const Loop* loop) {
  for (auto itr = node->graph_begin(); itr != node->graph_end(); ++itr) {
    SERecurrentNode* rec = itr->AsSERecurrentNode();
    if (rec && rec->GetLoop() == loop) {
      return rec;
    }
  }
  return nullptr;
}